

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

void __thiscall
tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
          (ConstPixelBufferAccess *this,TextureLevel *level)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  this->m_format = level->m_format;
  lVar3 = 2;
  do {
    (this->m_size).m_data[lVar3 + -2] = (level->m_size).m_data[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  iVar2 = getPixelSize(this->m_format);
  iVar4 = (this->m_size).m_data[0] * iVar2;
  iVar1 = (this->m_size).m_data[1];
  (this->m_pitch).m_data[0] = iVar2;
  (this->m_pitch).m_data[1] = iVar4;
  (this->m_pitch).m_data[2] = iVar1 * iVar4;
  this->m_data = (level->m_data).m_ptr;
  return;
}

Assistant:

ConstPixelBufferAccess::ConstPixelBufferAccess (const TextureLevel& level)
	: m_format		(level.getFormat())
	, m_size		(level.getSize())
	, m_pitch		(calculatePackedPitch(m_format, m_size))
	, m_data		((void*)level.getPtr())
{
}